

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void __thiscall iutest::TestEnv::Variable::Variable(Variable *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  this->m_random_seed = 0;
  this->m_current_random_seed = 0;
  this->m_before_origin_random_seed = 0;
  this->m_repeat_count = 1;
  (this->m_output_option).m_value._M_dataplus._M_p =
       (pointer)&(this->m_output_option).m_value.field_2;
  (this->m_output_option).m_value._M_string_length = 0;
  (this->m_output_option).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_test_filter)._M_dataplus._M_p = (pointer)&(this->m_test_filter).field_2;
  (this->m_test_filter)._M_string_length = 0;
  (this->m_test_filter).field_2._M_local_buf[0] = '\0';
  (this->m_flagfile)._M_dataplus._M_p = (pointer)&(this->m_flagfile).field_2;
  (this->m_flagfile)._M_string_length = 0;
  (this->m_flagfile).field_2._M_local_buf[0] = '\0';
  (this->m_stream_result_to).m_value._M_dataplus._M_p =
       (pointer)&(this->m_stream_result_to).m_value.field_2;
  (this->m_stream_result_to).m_value._M_string_length = 0;
  (this->m_stream_result_to).m_value.field_2._M_local_buf[0] = '\0';
  (this->m_default_package_name)._M_dataplus._M_p = (pointer)&(this->m_default_package_name).field_2
  ;
  (this->m_default_package_name)._M_string_length = 0;
  (this->m_default_package_name).field_2._M_local_buf[0] = '\0';
  (this->m_genrand).m_engine.m_v4 = 0;
  (this->m_genrand).m_engine.m_v3 = 0x6c078965;
  (this->m_genrand).m_engine.m_v1 = 0x2016830a;
  (this->m_genrand).m_engine.m_v2 = 0x714acb3e;
  detail::iuRandom::init(&this->m_genrand,in_RSI);
  (this->m_environment_list).
  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_environment_list).
  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_environment_list).
  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_event_listeners).m_repeater.super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_00125320;
  (this->m_event_listeners).m_repeater.m_listeners.
  super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_event_listeners).m_repeater.m_listeners.
  super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_event_listeners).m_repeater.m_listeners.
  super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_event_listeners).m_default_result_printer = (TestEventListener *)0x0;
  (this->m_event_listeners).m_default_xml_generator = (TestEventListener *)0x0;
  this->m_testpartresult_reporter = (TestPartResultReporterInterface *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_ostream_formatter);
  (this->m_locale_ctype)._M_dataplus._M_p = (pointer)&(this->m_locale_ctype).field_2;
  (this->m_locale_ctype)._M_string_length = 0;
  (this->m_locale_ctype).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Variable()
            : m_random_seed(0)
            , m_current_random_seed(0)
            , m_before_origin_random_seed(0)
            , m_repeat_count(1)
            , m_testpartresult_reporter(NULL)
        {}